

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printSIMDType10Operand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  uint64_t uVar4;
  uint64_t Val;
  uint8_t RawVal;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  uVar4 = AArch64_AM_decodeAdvSIMDModImmType10((uint8_t)iVar3);
  SStream_concat(O,"#%#016llx",uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(long *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = (long)(int)uVar4
    ;
    pcVar2 = MI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printSIMDType10Operand(MCInst *MI, unsigned OpNo, SStream *O)
{
	uint8_t RawVal = (uint8_t)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	uint64_t Val = AArch64_AM_decodeAdvSIMDModImmType10(RawVal);
	SStream_concat(O, "#%#016llx", Val);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}